

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputLZWDecodeStream.cpp
# Opt level: O1

int __thiscall InputLZWDecodeStream::GetCode(InputLZWDecodeStream *this)

{
  uint uVar1;
  undefined8 in_RAX;
  byte bVar2;
  int iVar3;
  int iVar4;
  Byte buffer;
  undefined8 uStack_18;
  
  iVar3 = this->inputBits;
  iVar4 = this->nextBits;
  if (iVar3 < iVar4) {
    uStack_18 = in_RAX;
    do {
      (*this->mSourceStream->_vptr_IByteReader[2])(this->mSourceStream,(long)&uStack_18 + 7,1);
      this->inputBuf = this->inputBuf << 8 | (uint)uStack_18._7_1_;
      iVar3 = this->inputBits + 8;
      this->inputBits = iVar3;
      iVar4 = this->nextBits;
    } while (iVar3 < iVar4);
  }
  uVar1 = this->inputBuf;
  bVar2 = (byte)(iVar3 - iVar4);
  this->inputBits = iVar3 - iVar4;
  this->inputBuf = ~(-1 << (bVar2 & 0x1f)) & uVar1;
  return ~(-1 << ((byte)iVar4 & 0x1f)) & (int)uVar1 >> (bVar2 & 0x1f);
}

Assistant:

int InputLZWDecodeStream::GetCode() {
	int c;
	int code;

	IOBasicTypes::Byte buffer;
	while (inputBits < nextBits) 
	{
		mSourceStream->Read(&buffer, 1);
		c = buffer;

		if (c == -1) return -1;
		inputBuf = (inputBuf << 8) | (c & 0xff);
		inputBits += 8;
	}
	code = (inputBuf >> (inputBits - nextBits)) & ((1 << nextBits) - 1);
	inputBits -= nextBits;
	inputBuf = inputBuf & ((1 << inputBits) - 1); // avoid overflow by limiting to the bits its supposed to use 
	return code;
}